

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O2

void __thiscall arma::Mat<double>::Mat(Mat<double> *this,Mat<double> *X)

{
  uint uVar1;
  uword uVar2;
  uword uVar3;
  uword uVar4;
  
  uVar2 = X->n_cols;
  uVar3 = X->n_elem;
  uVar4 = X->n_alloc;
  uVar1 = X->n_alloc;
  this->n_rows = X->n_rows;
  this->n_cols = uVar2;
  this->n_elem = uVar3;
  this->n_alloc = uVar4;
  this->vec_state = 0;
  this->mem_state = 0;
  this->mem = (double *)0x0;
  if ((ushort)(X->mem_state - 1) < 2 || 0x10 < uVar1) {
    this->mem_state = X->mem_state;
    this->mem = X->mem;
    X->mem_state = 0;
    X->mem = (double *)0x0;
    X->n_rows = 0;
    X->n_cols = 0;
    X->n_elem = 0;
    X->n_alloc = 0;
  }
  else {
    init_cold(this);
    if (this->mem != X->mem && (ulong)X->n_elem != 0) {
      memcpy(this->mem,X->mem,(ulong)X->n_elem << 3);
    }
    if ((X->mem_state == 0) && (X->n_alloc < 0x11)) {
      X->n_rows = 0;
      X->n_cols = 0;
      X->n_elem = 0;
      X->mem = (double *)0x0;
    }
  }
  return;
}

Assistant:

inline
Mat<eT>::Mat(Mat<eT>&& X)
  : n_rows   (X.n_rows )
  , n_cols   (X.n_cols )
  , n_elem   (X.n_elem )
  , n_alloc  (X.n_alloc)
  , vec_state(0        )
  , mem_state(0        )
  , mem      (         )
  {
  arma_debug_sigprint(arma_str::format("this: %x; X: %x") % this % &X);
  
  if( (X.n_alloc > arma_config::mat_prealloc) || (X.mem_state == 1) || (X.mem_state == 2) )
    {
    access::rw(mem_state) = X.mem_state;
    access::rw(mem)       = X.mem;
    
    access::rw(X.n_rows)    = 0;
    access::rw(X.n_cols)    = 0;
    access::rw(X.n_elem)    = 0;
    access::rw(X.n_alloc)   = 0;
    access::rw(X.mem_state) = 0;
    access::rw(X.mem)       = nullptr;
    }
  else  // condition: (X.n_alloc <= arma_config::mat_prealloc) || (X.mem_state == 0) || (X.mem_state == 3)
    {
    init_cold();
    
    arrayops::copy( memptr(), X.mem, X.n_elem );
    
    if( (X.mem_state == 0) && (X.n_alloc <= arma_config::mat_prealloc) )
      {
      access::rw(X.n_rows) = 0;
      access::rw(X.n_cols) = 0;
      access::rw(X.n_elem) = 0;
      access::rw(X.mem)    = nullptr;
      }
    }
  }